

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O0

void __thiscall
glslang::TParseContext::rValueErrorCheck
          (TParseContext *this,TSourceLoc *loc,char *op,TIntermTyped *node)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  TQualifier *pTVar4;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *this_00;
  char *pcVar5;
  undefined4 extraout_var_00;
  TIntermSymbol *symNode;
  TIntermTyped *node_local;
  char *op_local;
  TSourceLoc *loc_local;
  TParseContext *this_local;
  long *plVar3;
  
  TParseContextBase::rValueErrorCheck(&this->super_TParseContextBase,loc,op,node);
  iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0xc])();
  plVar3 = (long *)CONCAT44(extraout_var,iVar2);
  if (plVar3 != (long *)0x0) {
    pTVar4 = (TQualifier *)(**(code **)(*plVar3 + 0x108))();
    bVar1 = TQualifier::isWriteOnly(pTVar4);
    if (bVar1) goto LAB_0076013a;
  }
  if (plVar3 != (long *)0x0) {
    pTVar4 = (TQualifier *)(**(code **)(*plVar3 + 0x108))();
    bVar1 = TQualifier::isExplicitInterpolation(pTVar4);
    if (bVar1) {
      this_00 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)
                (**(code **)(*plVar3 + 400))();
      pcVar5 = std::__cxx11::
               basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::c_str
                         (this_00);
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"can\'t read from explicitly-interpolated object: ",op,pcVar5);
    }
  }
LAB_0076013a:
  iVar2 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x21])();
  if (((((uint)(*(ulong *)(CONCAT44(extraout_var_00,iVar2) + 8) >> 7) & 0x1ff) == 2) &&
      (bVar1 = TIntermediate::isLocalSizeSet
                         ((this->super_TParseContextBase).super_TParseVersions.intermediate), !bVar1
      )) && (bVar1 = TIntermediate::isLocalSizeSpecialized
                               ((this->super_TParseContextBase).super_TParseVersions.intermediate),
            !bVar1)) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,
               "can\'t read from gl_WorkGroupSize before a fixed workgroup size has been declared",
               op,"");
  }
  return;
}

Assistant:

void TParseContext::rValueErrorCheck(const TSourceLoc& loc, const char* op, TIntermTyped* node)
{
    // Let the base class check errors
    TParseContextBase::rValueErrorCheck(loc, op, node);

    TIntermSymbol* symNode = node->getAsSymbolNode();
    if (!(symNode && symNode->getQualifier().isWriteOnly())) // base class checks
        if (symNode && symNode->getQualifier().isExplicitInterpolation())
            error(loc, "can't read from explicitly-interpolated object: ", op, symNode->getName().c_str());

    // local_size_{xyz} must be assigned or specialized before gl_WorkGroupSize can be assigned.
    if(node->getQualifier().builtIn == EbvWorkGroupSize &&
       !(intermediate.isLocalSizeSet() || intermediate.isLocalSizeSpecialized()))
        error(loc, "can't read from gl_WorkGroupSize before a fixed workgroup size has been declared", op, "");
}